

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bounding_box.hpp
# Opt level: O0

BB<double> * surround_box<double>(BB<double> bb0,BB<double> bb1)

{
  point3<double> max;
  BB<double> *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  vec3<double> big;
  vec3<double> small;
  point3<double> local_150;
  point3<double> local_138;
  point3<double> local_120;
  point3<double> local_108;
  point3<double> local_f0;
  point3<double> local_d8;
  vec3<double> local_c0;
  point3<double> local_a8;
  point3<double> local_90;
  point3<double> local_78;
  point3<double> local_60;
  point3<double> local_48;
  point3<double> local_30;
  vec3<double> local_18;
  
  BB<double>::min(&local_30,(BB<double> *)&stack0x00000008);
  dVar1 = vec3<double>::getX(&local_30);
  BB<double>::min(&local_48,(BB<double> *)&stack0x00000038);
  dVar2 = vec3<double>::getX(&local_48);
  dVar7 = dVar2;
  if (dVar1 <= dVar2) {
    dVar7 = dVar1;
  }
  BB<double>::min(&local_60,(BB<double> *)&stack0x00000008);
  dVar3 = vec3<double>::getY(&local_60);
  BB<double>::min(&local_78,(BB<double> *)&stack0x00000038);
  dVar4 = vec3<double>::getY(&local_78);
  dVar8 = dVar4;
  if (dVar3 <= dVar4) {
    dVar8 = dVar3;
  }
  BB<double>::min(&local_90,(BB<double> *)&stack0x00000008);
  dVar5 = vec3<double>::getZ(&local_90);
  BB<double>::min(&local_a8,(BB<double> *)&stack0x00000038);
  dVar6 = vec3<double>::getZ(&local_a8);
  uVar9 = SUB84(dVar6,0);
  uVar10 = (int)((ulong)dVar6 >> 0x20);
  if (dVar5 <= dVar6) {
    uVar9 = SUB84(dVar5,0);
    uVar10 = (int)((ulong)dVar5 >> 0x20);
  }
  vec3<double>::vec3(&local_18,
                     (double)(~-(ulong)NAN(dVar1) & (ulong)dVar7 | -(ulong)NAN(dVar1) & (ulong)dVar2
                             ),
                     (double)(~-(ulong)NAN(dVar3) & (ulong)dVar8 | -(ulong)NAN(dVar3) & (ulong)dVar4
                             ),
                     (double)(~-(ulong)NAN(dVar5) & CONCAT44(uVar10,uVar9) |
                             -(ulong)NAN(dVar5) & (ulong)dVar6));
  BB<double>::max(&local_d8,(BB<double> *)&stack0x00000008);
  dVar1 = vec3<double>::getX(&local_d8);
  BB<double>::max(&local_f0,(BB<double> *)&stack0x00000038);
  dVar2 = vec3<double>::getX(&local_f0);
  dVar7 = dVar2;
  if (dVar2 <= dVar1) {
    dVar7 = dVar1;
  }
  BB<double>::max(&local_108,(BB<double> *)&stack0x00000008);
  dVar3 = vec3<double>::getY(&local_108);
  BB<double>::max(&local_120,(BB<double> *)&stack0x00000038);
  dVar4 = vec3<double>::getY(&local_120);
  dVar8 = dVar4;
  if (dVar4 <= dVar3) {
    dVar8 = dVar3;
  }
  BB<double>::max(&local_138,(BB<double> *)&stack0x00000008);
  dVar5 = vec3<double>::getZ(&local_138);
  BB<double>::max(&local_150,(BB<double> *)&stack0x00000038);
  dVar6 = vec3<double>::getZ(&local_150);
  uVar9 = SUB84(dVar6,0);
  uVar10 = (int)((ulong)dVar6 >> 0x20);
  if (dVar6 <= dVar5) {
    uVar9 = SUB84(dVar5,0);
    uVar10 = (int)((ulong)dVar5 >> 0x20);
  }
  vec3<double>::vec3(&local_c0,
                     (double)(~-(ulong)NAN(dVar1) & (ulong)dVar7 | -(ulong)NAN(dVar1) & (ulong)dVar2
                             ),
                     (double)(~-(ulong)NAN(dVar3) & (ulong)dVar8 | -(ulong)NAN(dVar3) & (ulong)dVar4
                             ),
                     (double)(~-(ulong)NAN(dVar5) & CONCAT44(uVar10,uVar9) |
                             -(ulong)NAN(dVar5) & (ulong)dVar6));
  max.e[1] = local_c0.e[1];
  max.e[0] = local_c0.e[0];
  max.e[2] = local_c0.e[2];
  BB<double>::BB(in_RDI,&local_18,max);
  return in_RDI;
}

Assistant:

BB<T> surround_box(BB<T> bb0, BB<T> bb1) {
  vec3<T> small(fmin(bb0.min().getX(), bb1.min().getX()),
                fmin(bb0.min().getY(), bb1.min().getY()),
                fmin(bb0.min().getZ(), bb1.min().getZ()));
  vec3<T> big(fmax(bb0.max().getX(), bb1.max().getX()),
              fmax(bb0.max().getY(), bb1.max().getY()),
              fmax(bb0.max().getZ(), bb1.max().getZ()));

  return BB<T>(small, big);
}